

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Semi(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Cec_ParSmf_t Pars;
  Cec_ParSmf_t local_60;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Cec_ManSmfSetDefaultParams(&local_60);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"WRFSMCTmdvh"), iVar6 = globalUtilOptind, 99 < iVar1)
    {
      piVar3 = &local_60.fDualOut;
      if ((iVar1 != 100) && (piVar3 = &local_60.fCheckMiter, iVar1 != 0x6d)) {
        if (iVar1 != 0x76) goto switchD_0027d53b_caseD_4e;
        piVar3 = &local_60.fVerbose;
      }
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    if (iVar1 < 0x4d) {
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
          goto LAB_0027d69d;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nBTLimit = uVar2;
      }
      else {
        if (iVar1 != 0x46) {
          if (iVar1 == -1) {
            if (local_38->pGia != (Gia_Man_t *)0x0) {
              Cec_ManSeqSemiformal(local_38->pGia,&local_60);
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9Resim(): There is no AIG.\n";
            iVar6 = -1;
            goto LAB_0027d7f2;
          }
          break;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_0027d69d;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nFrames = uVar2;
      }
    }
    else {
      switch(iVar1) {
      case 0x4d:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
LAB_0027d69d:
          Abc_Print(-1,pcVar4);
          goto switchD_0027d53b_caseD_4e;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nMinOutputs = uVar2;
        break;
      default:
        goto switchD_0027d53b_caseD_4e;
      case 0x52:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
          goto LAB_0027d69d;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nRounds = uVar2;
        break;
      case 0x53:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_0027d69d;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nNonRefines = uVar2;
        break;
      case 0x54:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_0027d69d;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.TimeLimit = uVar2;
        break;
      case 0x57:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_0027d69d;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_60.nWords = uVar2;
      }
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar2);
switchD_0027d53b_caseD_4e:
  Abc_Print(-2,"usage: &semi [-WRFSMCT num] [-mdvh]\n");
  Abc_Print(-2,"\t         performs semiformal refinement of equivalence classes\n");
  Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
            (ulong)(uint)local_60.nWords);
  Abc_Print(-2,"\t-R num : the max number of rounds to simulate [default = %d]\n",
            (ulong)(uint)local_60.nRounds);
  Abc_Print(-2,"\t-F num : the max number of frames to unroll [default = %d]\n",
            (ulong)(uint)local_60.nFrames);
  Abc_Print(-2,"\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n",
            (ulong)(uint)local_60.nNonRefines);
  Abc_Print(-2,"\t-M num : the min number of outputs of bounded SRM [default = %d]\n",
            (ulong)(uint)local_60.nMinOutputs);
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_60.nBTLimit);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
            (ulong)(uint)local_60.TimeLimit);
  pcVar4 = "miter";
  if (local_60.fCheckMiter == 0) {
    pcVar4 = "circuit";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar4);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_60.fDualOut == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle using two POs intead of XOR [default = %s]\n",pcVar4);
  if (local_60.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_0027d7f2:
  Abc_Print(iVar6,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Semi( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParSmf_t Pars, * pPars = &Pars;
    int c;
    Cec_ManSmfSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRFSMCTmdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNonRefines = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNonRefines < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMinOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMinOutputs < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOut ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resim(): There is no AIG.\n" );
        return 1;
    }
    Cec_ManSeqSemiformal( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &semi [-WRFSMCT num] [-mdvh]\n" );
    Abc_Print( -2, "\t         performs semiformal refinement of equivalence classes\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-R num : the max number of rounds to simulate [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-F num : the max number of frames to unroll [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n", pPars->nNonRefines );
    Abc_Print( -2, "\t-M num : the min number of outputs of bounded SRM [default = %d]\n", pPars->nMinOutputs );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-d     : toggle using two POs intead of XOR [default = %s]\n", pPars->fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}